

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O3

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true> __thiscall
duckdb::ArrowType::GetTypeFromFormat(ArrowType *this,string *format)

{
  pointer pcVar1;
  char *pcVar2;
  pointer pcVar3;
  int iVar4;
  reference pvVar5;
  unsigned_long_long val;
  unsigned_long_long val_00;
  element_type *peVar6;
  InvalidInputException *pIVar7;
  NotImplementedException *pNVar8;
  LogicalTypeId *args;
  unsigned_long_long params;
  string parameters_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  extra_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  parameters;
  uint8_t in_stack_ffffffffffffff0d;
  uint8_t in_stack_ffffffffffffff0e;
  DecimalBitWidth local_e9;
  undefined1 local_e8 [32];
  _Tuple_impl<0UL,_duckdb::ArrowDecimalInfo_*,_std::default_delete<duckdb::ArrowDecimalInfo>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = ::std::__cxx11::string::compare((char *)format);
  if (iVar4 == 0) {
    peVar6 = (element_type *)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)local_e8,SQLNULL);
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)format);
    if (iVar4 == 0) {
      peVar6 = (element_type *)operator_new(0x68);
      LogicalType::LogicalType((LogicalType *)local_e8,BOOLEAN);
    }
    else {
      iVar4 = ::std::__cxx11::string::compare((char *)format);
      if (iVar4 == 0) {
        peVar6 = (element_type *)operator_new(0x68);
        LogicalType::LogicalType((LogicalType *)local_e8,TINYINT);
      }
      else {
        iVar4 = ::std::__cxx11::string::compare((char *)format);
        if (iVar4 == 0) {
          peVar6 = (element_type *)operator_new(0x68);
          LogicalType::LogicalType((LogicalType *)local_e8,SMALLINT);
        }
        else {
          iVar4 = ::std::__cxx11::string::compare((char *)format);
          if (iVar4 != 0) {
            iVar4 = ::std::__cxx11::string::compare((char *)format);
            if (iVar4 == 0) {
              args = &LogicalType::BIGINT;
            }
            else {
              iVar4 = ::std::__cxx11::string::compare((char *)format);
              if (iVar4 == 0) {
                args = &LogicalType::UTINYINT;
              }
              else {
                iVar4 = ::std::__cxx11::string::compare((char *)format);
                if (iVar4 == 0) {
                  args = &LogicalType::USMALLINT;
                }
                else {
                  iVar4 = ::std::__cxx11::string::compare((char *)format);
                  if (iVar4 == 0) {
                    args = &LogicalType::UINTEGER;
                  }
                  else {
                    iVar4 = ::std::__cxx11::string::compare((char *)format);
                    if (iVar4 == 0) {
                      args = &LogicalType::UBIGINT;
                    }
                    else {
                      iVar4 = ::std::__cxx11::string::compare((char *)format);
                      if (iVar4 == 0) {
                        args = &LogicalType::FLOAT;
                      }
                      else {
                        iVar4 = ::std::__cxx11::string::compare((char *)format);
                        if (iVar4 != 0) {
                          if (*(format->_M_dataplus)._M_p == 'd') {
                            StringUtil::Split(&local_c0,(string *)format,':');
                            if ((long)local_c0.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_c0.
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start != 0x40) {
                              pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                              local_e8._0_8_ = local_e8 + 0x10;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_e8,
                                         "Decimal format of Arrow object is incomplete, it is missing the scale and width. Current format: %s"
                                         ,"");
                              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
                              pcVar3 = (format->_M_dataplus)._M_p;
                              ::std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_50,pcVar3,
                                         pcVar3 + format->_M_string_length);
                              InvalidInputException::InvalidInputException<std::__cxx11::string>
                                        (pIVar7,(string *)local_e8,&local_50);
                              __cxa_throw(pIVar7,&InvalidInputException::typeinfo,
                                          ::std::runtime_error::~runtime_error);
                            }
                            pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                     ::operator[](&local_c0,1);
                            pcVar1 = local_e8 + 0x10;
                            local_e8._0_8_ = pcVar1;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_e8,",","");
                            StringUtil::Split(&local_a8,(string *)pvVar5,(string *)local_e8);
                            if ((pointer)local_e8._0_8_ != pcVar1) {
                              operator_delete((void *)local_e8._0_8_);
                            }
                            if (((long)local_a8.
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 CONCAT71(local_a8.
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                          local_a8.
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._0_1_) &
                                0xffffffffffffffc0U) == 0x40) {
                              pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                       ::operator[](&local_a8,0);
                              val = ::std::__cxx11::stoull(pvVar5,(size_t *)0x0,10);
                              pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                       ::operator[](&local_a8,1);
                              val_00 = ::std::__cxx11::stoull(pvVar5,(size_t *)0x0,10);
                              params = 0x80;
                              if ((long)local_a8.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  CONCAT71(local_a8.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                           local_a8.
                                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_1_) == 0x60)
                              {
                                pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                         ::operator[](&local_a8,2);
                                params = ::std::__cxx11::stoull(pvVar5,(size_t *)0x0,10);
                              }
                              if ((val < 0x27) && (params < 0x81)) {
                                switch(params << 0x3b | params - 0x20 >> 5) {
                                case 0:
                                  NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(val)
                                  ;
                                  NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert
                                            (val_00);
                                  LogicalType::DECIMAL
                                            (in_stack_ffffffffffffff0e,in_stack_ffffffffffffff0d);
                                  local_e9 = DECIMAL_32;
                                  make_uniq<duckdb::ArrowDecimalInfo,duckdb::DecimalBitWidth>
                                            ((duckdb *)&local_c8,&local_e9);
                                  make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowDecimalInfo,std::default_delete<duckdb::ArrowDecimalInfo>,true>>
                                            ((duckdb *)this,(LogicalType *)local_e8,
                                             (unique_ptr<duckdb::ArrowDecimalInfo,_std::default_delete<duckdb::ArrowDecimalInfo>,_true>
                                              *)&local_c8);
                                  break;
                                case 1:
                                  NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(val)
                                  ;
                                  NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert
                                            (val_00);
                                  LogicalType::DECIMAL
                                            (in_stack_ffffffffffffff0e,in_stack_ffffffffffffff0d);
                                  local_e9 = DECIMAL_64;
                                  make_uniq<duckdb::ArrowDecimalInfo,duckdb::DecimalBitWidth>
                                            ((duckdb *)&local_c8,&local_e9);
                                  make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowDecimalInfo,std::default_delete<duckdb::ArrowDecimalInfo>,true>>
                                            ((duckdb *)this,(LogicalType *)local_e8,
                                             (unique_ptr<duckdb::ArrowDecimalInfo,_std::default_delete<duckdb::ArrowDecimalInfo>,_true>
                                              *)&local_c8);
                                  break;
                                default:
                                  pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10)
                                  ;
                                  local_e8._0_8_ = pcVar1;
                                  ::std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_e8,
                                             "Unsupported bit-width value of %d  for Arrow Decimal type"
                                             ,"");
                                  NotImplementedException::NotImplementedException<unsigned_long>
                                            (pNVar8,(string *)local_e8,params);
                                  __cxa_throw(pNVar8,&NotImplementedException::typeinfo,
                                              ::std::runtime_error::~runtime_error);
                                case 3:
                                  NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(val)
                                  ;
                                  NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert
                                            (val_00);
                                  LogicalType::DECIMAL
                                            (in_stack_ffffffffffffff0e,in_stack_ffffffffffffff0d);
                                  local_e9 = DECIMAL_128;
                                  make_uniq<duckdb::ArrowDecimalInfo,duckdb::DecimalBitWidth>
                                            ((duckdb *)&local_c8,&local_e9);
                                  make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowDecimalInfo,std::default_delete<duckdb::ArrowDecimalInfo>,true>>
                                            ((duckdb *)this,(LogicalType *)local_e8,
                                             (unique_ptr<duckdb::ArrowDecimalInfo,_std::default_delete<duckdb::ArrowDecimalInfo>,_true>
                                              *)&local_c8);
                                  break;
                                case 7:
                                  NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert(val)
                                  ;
                                  NumericCastImpl<unsigned_char,_unsigned_long,_false>::Convert
                                            (val_00);
                                  LogicalType::DECIMAL
                                            (in_stack_ffffffffffffff0e,in_stack_ffffffffffffff0d);
                                  local_e9 = DECIMAL_256;
                                  make_uniq<duckdb::ArrowDecimalInfo,duckdb::DecimalBitWidth>
                                            ((duckdb *)&local_c8,&local_e9);
                                  make_uniq<duckdb::ArrowType,duckdb::LogicalType,duckdb::unique_ptr<duckdb::ArrowDecimalInfo,std::default_delete<duckdb::ArrowDecimalInfo>,true>>
                                            ((duckdb *)this,(LogicalType *)local_e8,
                                             (unique_ptr<duckdb::ArrowDecimalInfo,_std::default_delete<duckdb::ArrowDecimalInfo>,_true>
                                              *)&local_c8);
                                }
                                if (local_c8.
                                    super__Head_base<0UL,_duckdb::ArrowDecimalInfo_*,_false>.
                                    _M_head_impl != (ArrowDecimalInfo *)0x0) {
                                  ArrowDateTimeInfo::~ArrowDateTimeInfo
                                            ((ArrowDateTimeInfo *)
                                             local_c8.
                                             super__Head_base<0UL,_duckdb::ArrowDecimalInfo_*,_false>
                                             ._M_head_impl);
                                  operator_delete((void *)local_c8.
                                                  super__Head_base<0UL,_duckdb::ArrowDecimalInfo_*,_false>
                                                  ._M_head_impl);
                                }
                                LogicalType::~LogicalType((LogicalType *)local_e8);
                                ::std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&local_a8);
                                ::std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&local_c0);
                                return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                        )this;
                              }
                              pNVar8 = (NotImplementedException *)__cxa_allocate_exception(0x10);
                              local_e8._0_8_ = pcVar1;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_e8,
                                         "Unsupported Internal Arrow Type for Decimal %s","");
                              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                              pcVar3 = (format->_M_dataplus)._M_p;
                              ::std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_90,pcVar3,
                                         pcVar3 + format->_M_string_length);
                              NotImplementedException::NotImplementedException<std::__cxx11::string>
                                        (pNVar8,(string *)local_e8,&local_90);
                              __cxa_throw(pNVar8,&NotImplementedException::typeinfo,
                                          ::std::runtime_error::~runtime_error);
                            }
                            pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                            local_e8._0_8_ = pcVar1;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_e8,
                                       "Decimal format of Arrow object is incomplete, it is missing the scale or width. Current format: %s"
                                       ,"");
                            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                            pcVar3 = (format->_M_dataplus)._M_p;
                            ::std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_70,pcVar3,pcVar3 + format->_M_string_length)
                            ;
                            InvalidInputException::InvalidInputException<std::__cxx11::string>
                                      (pIVar7,(string *)local_e8,&local_70);
                            __cxa_throw(pIVar7,&InvalidInputException::typeinfo,
                                        ::std::runtime_error::~runtime_error);
                          }
                          iVar4 = ::std::__cxx11::string::compare((char *)format);
                          if (iVar4 == 0) {
                            local_c0.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)((ulong)local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                          0xffffffffffffff00);
                            make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                      ((duckdb *)local_e8,(ArrowVariableSizeType *)&local_c0);
                            make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                      ((duckdb *)this,&LogicalType::VARCHAR,
                                       (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                        *)local_e8);
                          }
                          else {
                            iVar4 = ::std::__cxx11::string::compare((char *)format);
                            if (iVar4 == 0) {
                              local_c0.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,2)
                              ;
                              make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                        ((duckdb *)local_e8,(ArrowVariableSizeType *)&local_c0);
                              make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                        ((duckdb *)this,&LogicalType::VARCHAR,
                                         (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                          *)local_e8);
                            }
                            else {
                              iVar4 = ::std::__cxx11::string::compare((char *)format);
                              if (iVar4 != 0) {
                                iVar4 = ::std::__cxx11::string::compare((char *)format);
                                if (iVar4 == 0) {
                                  local_e8[0] = 0x14;
                                }
                                else {
                                  iVar4 = ::std::__cxx11::string::compare((char *)format);
                                  if (iVar4 == 0) {
                                    local_e8[0] = 0x13;
                                  }
                                  else {
                                    iVar4 = ::std::__cxx11::string::compare((char *)format);
                                    if (iVar4 == 0) {
                                      local_e8[0] = 0x12;
                                    }
                                    else {
                                      iVar4 = ::std::__cxx11::string::compare((char *)format);
                                      if (iVar4 != 0) {
                                        iVar4 = ::std::__cxx11::string::compare((char *)format);
                                        if (iVar4 == 0) {
                                          local_c0.
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start =
                                               (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,4)
                                          ;
                                          make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                    ((duckdb *)local_e8,
                                                     (ArrowDateTimeType *)&local_c0);
                                          make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                    ((duckdb *)this,&LogicalType::DATE,
                                                     (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                        }
                                        else {
                                          iVar4 = ::std::__cxx11::string::compare((char *)format);
                                          if (iVar4 == 0) {
                                            local_c0.
                                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start =
                                                 (pointer)((ulong)local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffffffffff00);
                                            make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                      ((duckdb *)local_e8,
                                                       (ArrowDateTimeType *)&local_c0);
                                            make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                      ((duckdb *)this,&LogicalType::DATE,
                                                       (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                          }
                                          else {
                                            iVar4 = ::std::__cxx11::string::compare((char *)format);
                                            if (iVar4 == 0) {
                                              local_c0.
                                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start =
                                                   (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,3)
                                              ;
                                              make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                        ((duckdb *)local_e8,
                                                         (ArrowDateTimeType *)&local_c0);
                                              make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                        ((duckdb *)this,&LogicalType::TIME,
                                                         (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                            }
                                            else {
                                              iVar4 = ::std::__cxx11::string::compare
                                                                ((char *)format);
                                              if (iVar4 == 0) {
                                                local_c0.
                                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start =
                                                     (pointer)((ulong)local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffffffffff00);
                                                make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                          ((duckdb *)local_e8,
                                                           (ArrowDateTimeType *)&local_c0);
                                                make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                          ((duckdb *)this,&LogicalType::TIME,
                                                           (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                              }
                                              else {
                                                iVar4 = ::std::__cxx11::string::compare
                                                                  ((char *)format);
                                                if (iVar4 == 0) {
                                                  local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,1)
                                                  ;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::TIME,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                                }
                                                else {
                                                  iVar4 = ::std::__cxx11::string::compare
                                                                    ((char *)format);
                                                  if (iVar4 == 0) {
                                                    local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,2)
                                                  ;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::TIME,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,3)
                                                  ;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)((ulong)local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffffffffff00);
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,1)
                                                  ;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,2)
                                                  ;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,4)
                                                  ;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,5)
                                                  ;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,6)
                                                  ;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowDateTimeInfo,std::default_delete<duckdb::ArrowDateTimeInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::INTERVAL,
                                                             (
                                                  unique_ptr<duckdb::ArrowDateTimeInfo,_std::default_delete<duckdb::ArrowDateTimeInfo>,_true>
                                                  *)local_e8);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 == 0) {
                                                      local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)((ulong)local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffffffffff00);
                                                  make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowVariableSizeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::BLOB,
                                                             (
                                                  unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                                  *)local_e8);
                                                  }
                                                  else {
                                                    iVar4 = ::std::__cxx11::string::compare
                                                                      ((char *)format);
                                                    if (iVar4 != 0) {
                                                      pcVar2 = (format->_M_dataplus)._M_p;
                                                      if (*pcVar2 == 't') {
                                                        if (pcVar2[1] == 's') {
                                                          switch(pcVar2[2]) {
                                                          case 'm':
                                                            local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
                                                       (duckdb)0x0;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_a8);
                                                  break;
                                                  case 'n':
                                                    local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
                                                       (duckdb)0x2;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_a8);
                                                  break;
                                                  default:
                                                    pNVar8 = (NotImplementedException *)
                                                             __cxa_allocate_exception(0x10);
                                                    local_e8._0_8_ = local_e8 + 0x10;
                                                    ::std::__cxx11::string::
                                                    _M_construct<char_const*>
                                                              ((string *)local_e8,
                                                                                                                              
                                                  " Timestamptz precision of not accepted","");
                                                  NotImplementedException::NotImplementedException
                                                            (pNVar8,(string *)local_e8);
                                                  __cxa_throw(pNVar8,&NotImplementedException::
                                                                      typeinfo,
                                                              ::std::runtime_error::~runtime_error);
                                                  case 's':
                                                    local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
                                                       (duckdb)0x3;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_a8);
                                                  break;
                                                  case 'u':
                                                    local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
                                                       (duckdb)0x1;
                                                  make_uniq<duckdb::ArrowDateTimeInfo,duckdb::ArrowDateTimeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowDateTimeType *)&local_a8);
                                                  }
                                                  local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)local_e8._0_8_;
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowTypeInfo,std::default_delete<duckdb::ArrowTypeInfo>,true>>
                                                            ((duckdb *)this,
                                                             &LogicalType::TIMESTAMP_TZ,
                                                             (
                                                  unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>
                                                  *)&local_c0);
                                                  local_e8._0_8_ =
                                                       local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start;
                                                  goto LAB_0115e37e;
                                                  }
                                                  }
                                                  else if (*pcVar2 == 'w') {
                                                    ::std::__cxx11::string::find((char)format,0x3a);
                                                    ::std::__cxx11::string::substr
                                                              ((ulong)local_e8,(ulong)format);
                                                    iVar4 = ::std::__cxx11::stoi
                                                                      ((string *)local_e8,
                                                                       (size_t *)0x0,10);
                                                    local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)
                                                  NumericCastImpl<unsigned_long,_int,_false>::
                                                  Convert(iVar4);
                                                  make_uniq<duckdb::ArrowStringInfo,unsigned_long&>
                                                            ((duckdb *)&local_a8,
                                                             (unsigned_long *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::BLOB,
                                                             (
                                                  unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                                  *)&local_a8);
                                                  if ((long *)CONCAT71(local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_)
                                                  != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_a8.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                                  8))();
                                                  }
                                                  if ((pointer)local_e8._0_8_ ==
                                                      (pointer)(local_e8 + 0x10)) {
                                                    return (
                                                  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                                  )this;
                                                  }
                                                  operator_delete((void *)local_e8._0_8_);
                                                  return (
                                                  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                                  )this;
                                                  }
                                                  (this->extension_data).internal.
                                                  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr = (element_type *)0x0;
                                                  return (
                                                  unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                                  )this;
                                                  }
                                                  local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start =
                                                       (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,2)
                                                  ;
                                                  make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                                            ((duckdb *)local_e8,
                                                             (ArrowVariableSizeType *)&local_c0);
                                                  make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                                            ((duckdb *)this,&LogicalType::BLOB,
                                                             (
                                                  unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                                  *)local_e8);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                        goto LAB_0115e37e;
                                      }
                                      local_e8[0] = 0x11;
                                    }
                                  }
                                }
                                make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId>
                                          ((duckdb *)this,local_e8);
                                return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                        )this;
                              }
                              local_c0.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start =
                                   (pointer)CONCAT71(local_c0.
                                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,3)
                              ;
                              make_uniq<duckdb::ArrowStringInfo,duckdb::ArrowVariableSizeType>
                                        ((duckdb *)local_e8,(ArrowVariableSizeType *)&local_c0);
                              make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&,duckdb::unique_ptr<duckdb::ArrowStringInfo,std::default_delete<duckdb::ArrowStringInfo>,true>>
                                        ((duckdb *)this,&LogicalType::VARCHAR,
                                         (unique_ptr<duckdb::ArrowStringInfo,_std::default_delete<duckdb::ArrowStringInfo>,_true>
                                          *)local_e8);
                            }
                          }
LAB_0115e37e:
                          if ((pointer)local_e8._0_8_ == (pointer)0x0) {
                            return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                    )this;
                          }
                          (**(code **)((((pointer)local_e8._0_8_)->_M_dataplus)._M_p + 8))();
                          return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
                                  )this;
                        }
                        args = &LogicalType::DOUBLE;
                      }
                    }
                  }
                }
              }
            }
            make_uniq<duckdb::ArrowType,duckdb::LogicalTypeId_const&>((duckdb *)this,args);
            return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>)this
            ;
          }
          peVar6 = (element_type *)operator_new(0x68);
          LogicalType::LogicalType((LogicalType *)local_e8,INTEGER);
        }
      }
    }
  }
  peVar6->arrow_to_duckdb = (cast_arrow_duck_t)0x0;
  peVar6->duckdb_to_arrow = (cast_duck_arrow_t)0x0;
  LogicalType::LogicalType(&peVar6->duckdb_type,(LogicalType *)local_e8);
  (peVar6->internal_type).id_ = INVALID;
  (peVar6->internal_type).physical_type_ = ~INVALID;
  *(undefined6 *)&(peVar6->internal_type).field_0x2 = 0;
  *(undefined1 *)
   &(peVar6->internal_type).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(peVar6->internal_type).type_info_.internal + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar6[1].arrow_to_duckdb = (cast_arrow_duck_t)&peVar6[1].duckdb_type;
  peVar6[1].duckdb_to_arrow = (cast_duck_arrow_t)0x0;
  peVar6[1].duckdb_type.id_ = INVALID;
  *(undefined1 *)
   &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&peVar6[1].duckdb_type.type_info_.internal + 8))->_M_pi = 0;
  (this->extension_data).internal.
  super___shared_ptr<duckdb::ArrowTypeExtensionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  LogicalType::~LogicalType((LogicalType *)local_e8);
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)this;
}

Assistant:

unique_ptr<ArrowType> ArrowType::GetTypeFromFormat(string &format) {
	if (format == "n") {
		return make_uniq<ArrowType>(LogicalType::SQLNULL);
	} else if (format == "b") {
		return make_uniq<ArrowType>(LogicalType::BOOLEAN);
	} else if (format == "c") {
		return make_uniq<ArrowType>(LogicalType::TINYINT);
	} else if (format == "s") {
		return make_uniq<ArrowType>(LogicalType::SMALLINT);
	} else if (format == "i") {
		return make_uniq<ArrowType>(LogicalType::INTEGER);
	} else if (format == "l") {
		return make_uniq<ArrowType>(LogicalType::BIGINT);
	} else if (format == "C") {
		return make_uniq<ArrowType>(LogicalType::UTINYINT);
	} else if (format == "S") {
		return make_uniq<ArrowType>(LogicalType::USMALLINT);
	} else if (format == "I") {
		return make_uniq<ArrowType>(LogicalType::UINTEGER);
	} else if (format == "L") {
		return make_uniq<ArrowType>(LogicalType::UBIGINT);
	} else if (format == "f") {
		return make_uniq<ArrowType>(LogicalType::FLOAT);
	} else if (format == "g") {
		return make_uniq<ArrowType>(LogicalType::DOUBLE);
	} else if (format[0] == 'd') { //! this can be either decimal128 or decimal 256 (e.g., d:38,0)
		auto extra_info = StringUtil::Split(format, ':');
		if (extra_info.size() != 2) {
			throw InvalidInputException(
			    "Decimal format of Arrow object is incomplete, it is missing the scale and width. Current format: %s",
			    format);
		}
		auto parameters = StringUtil::Split(extra_info[1], ",");
		// Parameters must always be 2 or 3 values (i.e., width, scale and an optional bit-width)
		if (parameters.size() != 2 && parameters.size() != 3) {
			throw InvalidInputException(
			    "Decimal format of Arrow object is incomplete, it is missing the scale or width. Current format: %s",
			    format);
		}
		uint64_t width = std::stoull(parameters[0]);
		uint64_t scale = std::stoull(parameters[1]);
		uint64_t bitwidth = 128;
		if (parameters.size() == 3) {
			// We have a bit-width defined
			bitwidth = std::stoull(parameters[2]);
		}
		if (width > 38 || bitwidth > 128) {
			throw NotImplementedException("Unsupported Internal Arrow Type for Decimal %s", format);
		}
		switch (bitwidth) {
		case 32:
			return make_uniq<ArrowType>(LogicalType::DECIMAL(NumericCast<uint8_t>(width), NumericCast<uint8_t>(scale)),
			                            make_uniq<ArrowDecimalInfo>(DecimalBitWidth::DECIMAL_32));
		case 64:
			return make_uniq<ArrowType>(LogicalType::DECIMAL(NumericCast<uint8_t>(width), NumericCast<uint8_t>(scale)),
			                            make_uniq<ArrowDecimalInfo>(DecimalBitWidth::DECIMAL_64));
		case 128:
			return make_uniq<ArrowType>(LogicalType::DECIMAL(NumericCast<uint8_t>(width), NumericCast<uint8_t>(scale)),
			                            make_uniq<ArrowDecimalInfo>(DecimalBitWidth::DECIMAL_128));
		case 256:
			return make_uniq<ArrowType>(LogicalType::DECIMAL(NumericCast<uint8_t>(width), NumericCast<uint8_t>(scale)),
			                            make_uniq<ArrowDecimalInfo>(DecimalBitWidth::DECIMAL_256));
		default:
			throw NotImplementedException("Unsupported bit-width value of %d  for Arrow Decimal type", bitwidth);
		}
	} else if (format == "u") {
		return make_uniq<ArrowType>(LogicalType::VARCHAR, make_uniq<ArrowStringInfo>(ArrowVariableSizeType::NORMAL));
	} else if (format == "U") {
		return make_uniq<ArrowType>(LogicalType::VARCHAR,
		                            make_uniq<ArrowStringInfo>(ArrowVariableSizeType::SUPER_SIZE));
	} else if (format == "vu") {
		return make_uniq<ArrowType>(LogicalType::VARCHAR, make_uniq<ArrowStringInfo>(ArrowVariableSizeType::VIEW));
	} else if (format == "tsn:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP_NS);
	} else if (format == "tsu:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP);
	} else if (format == "tsm:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP_MS);
	} else if (format == "tss:") {
		return make_uniq<ArrowType>(LogicalTypeId::TIMESTAMP_SEC);
	} else if (format == "tdD") {
		return make_uniq<ArrowType>(LogicalType::DATE, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::DAYS));
	} else if (format == "tdm") {
		return make_uniq<ArrowType>(LogicalType::DATE, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS));
	} else if (format == "tts") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::SECONDS));
	} else if (format == "ttm") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS));
	} else if (format == "ttu") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MICROSECONDS));
	} else if (format == "ttn") {
		return make_uniq<ArrowType>(LogicalType::TIME, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::NANOSECONDS));
	} else if (format == "tDs") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::SECONDS));
	} else if (format == "tDm") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS));
	} else if (format == "tDu") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MICROSECONDS));
	} else if (format == "tDn") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::NANOSECONDS));
	} else if (format == "tiD") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::DAYS));
	} else if (format == "tiM") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL, make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MONTHS));
	} else if (format == "tin") {
		return make_uniq<ArrowType>(LogicalType::INTERVAL,
		                            make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MONTH_DAY_NANO));
	} else if (format == "z") {
		auto type_info = make_uniq<ArrowStringInfo>(ArrowVariableSizeType::NORMAL);
		return make_uniq<ArrowType>(LogicalType::BLOB, std::move(type_info));
	} else if (format == "Z") {
		auto type_info = make_uniq<ArrowStringInfo>(ArrowVariableSizeType::SUPER_SIZE);
		return make_uniq<ArrowType>(LogicalType::BLOB, std::move(type_info));
	} else if (format[0] == 'w') {
		string parameters = format.substr(format.find(':') + 1);
		auto fixed_size = NumericCast<idx_t>(std::stoi(parameters));
		auto type_info = make_uniq<ArrowStringInfo>(fixed_size);
		return make_uniq<ArrowType>(LogicalType::BLOB, std::move(type_info));
	} else if (format[0] == 't' && format[1] == 's') {
		// Timestamp with Timezone
		// TODO right now we just get the UTC value. We probably want to support this properly in the future
		unique_ptr<ArrowTypeInfo> type_info;
		if (format[2] == 'n') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::NANOSECONDS);
		} else if (format[2] == 'u') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MICROSECONDS);
		} else if (format[2] == 'm') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::MILLISECONDS);
		} else if (format[2] == 's') {
			type_info = make_uniq<ArrowDateTimeInfo>(ArrowDateTimeType::SECONDS);
		} else {
			throw NotImplementedException(" Timestamptz precision of not accepted");
		}
		return make_uniq<ArrowType>(LogicalType::TIMESTAMP_TZ, std::move(type_info));
	}
	return nullptr;
}